

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::FieldDescriptor_const*,std::__cxx11::string_const&,google::protobuf::UnknownFieldSet_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  AlphaNum *in_R8;
  AlphaNum local_98;
  AlphaNum local_68;
  undefined8 local_38;
  char *local_30;
  
  local_38 = 8;
  local_30 = "Option \"";
  local_68.piece_._M_str = (char *)**(undefined8 **)this;
  local_68.piece_._M_len = (*(undefined8 **)this)[1];
  local_98.piece_._M_len = 0x12;
  local_98.piece_._M_str = "\" was already set.";
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_38,&local_68,&local_98,in_R8);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}